

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbiscan.cpp
# Opt level: O1

void __thiscall
icu_63::RBBIRuleScanner::findSetFor
          (RBBIRuleScanner *this,UnicodeString *s,RBBINode *node,UnicodeSet *setToAdopt)

{
  short sVar1;
  RBBIRuleBuilder *pRVar2;
  UErrorCode *pUVar3;
  UParseError *pUVar4;
  int8_t iVar5;
  uint start;
  void *pvVar6;
  RBBINode *this_00;
  undefined8 *buffer;
  UnicodeString *pUVar7;
  int32_t length;
  RBBINode *p;
  
  pUVar7 = s;
  pvVar6 = uhash_get_63(this->fSetTable,s);
  if (pvVar6 != (void *)0x0) {
    if (setToAdopt != (UnicodeSet *)0x0) {
      UnicodeSet::~UnicodeSet(setToAdopt);
      UMemory::operator_delete((UMemory *)setToAdopt,pUVar7);
    }
    node->fLeftChild = *(RBBINode **)((long)pvVar6 + 8);
    return;
  }
  if (setToAdopt == (UnicodeSet *)0x0) {
    sVar1 = (s->fUnion).fStackFields.fLengthAndFlags;
    if (sVar1 < 0) {
      length = (s->fUnion).fFields.fLength;
    }
    else {
      length = (int)sVar1 >> 5;
    }
    pUVar7 = (UnicodeString *)0x0;
    iVar5 = UnicodeString::doCompare(s,0,length,L"any",0,-1);
    if (iVar5 == '\0') {
      setToAdopt = (UnicodeSet *)UMemory::operator_new((UMemory *)0x58,(size_t)pUVar7);
      if (setToAdopt != (UnicodeSet *)0x0) {
        pUVar7 = (UnicodeString *)0x0;
        UnicodeSet::UnicodeSet(setToAdopt,0,0x10ffff);
        goto LAB_002a1972;
      }
    }
    else {
      pUVar7 = (UnicodeString *)0x0;
      start = UnicodeString::char32At(s,0);
      setToAdopt = (UnicodeSet *)UMemory::operator_new((UMemory *)0x58,(size_t)pUVar7);
      if (setToAdopt != (UnicodeSet *)0x0) {
        pUVar7 = (UnicodeString *)(ulong)start;
        UnicodeSet::UnicodeSet(setToAdopt,start,start);
        goto LAB_002a1972;
      }
    }
    setToAdopt = (UnicodeSet *)0x0;
  }
LAB_002a1972:
  this_00 = (RBBINode *)UMemory::operator_new((UMemory *)0xa0,(size_t)pUVar7);
  if (this_00 == (RBBINode *)0x0) {
    this_00 = (RBBINode *)0x0;
  }
  else {
    RBBINode::RBBINode(this_00,uset);
  }
  if (this_00 != (RBBINode *)0x0) {
    this_00->fInputSet = setToAdopt;
    this_00->fParent = node;
    node->fLeftChild = this_00;
    UnicodeString::operator=(&this_00->fText,s);
    p = this_00;
    UVector::addElement(this->fRB->fUSetNodes,this_00,this->fRB->fStatus);
    buffer = (undefined8 *)uprv_malloc_63(0x10);
    pUVar7 = (UnicodeString *)UMemory::operator_new((UMemory *)0x40,(size_t)p);
    if (pUVar7 == (UnicodeString *)0x0) {
      pUVar7 = (UnicodeString *)0x0;
    }
    else {
      UnicodeString::UnicodeString(pUVar7,s);
      p = (RBBINode *)s;
    }
    if (((setToAdopt != (UnicodeSet *)0x0) && (buffer != (undefined8 *)0x0)) &&
       (pUVar7 != (UnicodeString *)0x0)) {
      *buffer = pUVar7;
      buffer[1] = this_00;
      uhash_put_63(this->fSetTable,pUVar7,buffer,this->fRB->fStatus);
      return;
    }
    if (pUVar7 != (UnicodeString *)0x0) {
      (*(pUVar7->super_Replaceable).super_UObject._vptr_UObject[1])(pUVar7);
    }
    uprv_free_63(buffer);
    if (setToAdopt != (UnicodeSet *)0x0) {
      UnicodeSet::~UnicodeSet(setToAdopt);
      UMemory::operator_delete((UMemory *)setToAdopt,p);
    }
  }
  pRVar2 = this->fRB;
  pUVar3 = pRVar2->fStatus;
  if (*pUVar3 < U_ILLEGAL_ARGUMENT_ERROR) {
    *pUVar3 = U_MEMORY_ALLOCATION_ERROR;
    pUVar4 = pRVar2->fParseError;
    if (pUVar4 != (UParseError *)0x0) {
      pUVar4->line = this->fLineNum;
      pUVar4->offset = this->fCharNum;
      pUVar4->preContext[0] = L'\0';
      pUVar4->postContext[0] = L'\0';
    }
  }
  return;
}

Assistant:

void RBBIRuleScanner::findSetFor(const UnicodeString &s, RBBINode *node, UnicodeSet *setToAdopt) {

    RBBISetTableEl   *el;

    // First check whether we've already cached a set for this string.
    // If so, just use the cached set in the new node.
    //   delete any set provided by the caller, since we own it.
    el = (RBBISetTableEl *)uhash_get(fSetTable, &s);
    if (el != NULL) {
        delete setToAdopt;
        node->fLeftChild = el->val;
        U_ASSERT(node->fLeftChild->fType == RBBINode::uset);
        return;
    }

    // Haven't seen this set before.
    // If the caller didn't provide us with a prebuilt set,
    //   create a new UnicodeSet now.
    if (setToAdopt == NULL) {
        if (s.compare(kAny, -1) == 0) {
            setToAdopt = new UnicodeSet(0x000000, 0x10ffff);
        } else {
            UChar32 c;
            c = s.char32At(0);
            setToAdopt = new UnicodeSet(c, c);
        }
    }

    //
    // Make a new uset node to refer to this UnicodeSet
    // This new uset node becomes the child of the caller's setReference node.
    //
    RBBINode *usetNode    = new RBBINode(RBBINode::uset);
    if (usetNode == NULL) {
        error(U_MEMORY_ALLOCATION_ERROR);
        return;
    }
    usetNode->fInputSet   = setToAdopt;
    usetNode->fParent     = node;
    node->fLeftChild      = usetNode;
    usetNode->fText = s;


    //
    // Add the new uset node to the list of all uset nodes.
    //
    fRB->fUSetNodes->addElement(usetNode, *fRB->fStatus);


    //
    // Add the new set to the set hash table.
    //
    el      = (RBBISetTableEl *)uprv_malloc(sizeof(RBBISetTableEl));
    UnicodeString *tkey = new UnicodeString(s);
    if (tkey == NULL || el == NULL || setToAdopt == NULL) {
        // Delete to avoid memory leak
        delete tkey;
        tkey = NULL;
        uprv_free(el);
        el = NULL;
        delete setToAdopt;
        setToAdopt = NULL;

        error(U_MEMORY_ALLOCATION_ERROR);
        return;
    }
    el->key = tkey;
    el->val = usetNode;
    uhash_put(fSetTable, el->key, el, fRB->fStatus);

    return;
}